

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_json.hpp
# Opt level: O0

void __thiscall
jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>::
swap_l_r<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>::null_storage,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>::long_string_storage>
          (void *param_1,long_string_storage *param_2)

{
  long_string_storage *plVar1;
  basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *this;
  long_string_storage temp;
  basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *in_stack_ffffffffffffffc0;
  long_string_storage local_28;
  long_string_storage *local_18;
  void *local_10;
  
  local_18 = param_2;
  local_10 = param_1;
  plVar1 = cast<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>::long_string_storage>
                     (in_stack_ffffffffffffffc0);
  basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::long_string_storage::
  long_string_storage(&local_28,plVar1);
  plVar1 = local_18;
  this = (basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)
         cast<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>::null_storage>
                   (in_stack_ffffffffffffffc0);
  construct<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>::null_storage,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>::null_storage&>
            (this,(null_storage *)plVar1);
  construct<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>::long_string_storage,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>::long_string_storage&>
            (this,plVar1);
  return;
}

Assistant:

void swap_l_r(identity<TypeL>,identity<TypeR>,basic_json& other) noexcept
        {
            TypeR temp{other.cast<TypeR>()};
            other.construct<TypeL>(cast<TypeL>());
            construct<TypeR>(temp);
        }